

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest11::iterate(NegativeTest11 *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *pcVar3;
  allocator<char> local_250;
  allocator<char> local_24f;
  allocator<char> local_24e;
  allocator<char> local_24d;
  uint local_24c;
  GLuint *local_248;
  GLuint *local_240;
  Functions *local_238;
  string local_230;
  string local_210;
  string vs_body;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_238 = (Functions *)CONCAT44(extraout_var,iVar2);
  pcVar3 = "GL_ARB_shader_subroutine";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)&vs_body);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_240 = &this->m_vs_id;
  local_248 = &this->m_po_id;
  iVar2 = 0;
  this_00 = (ostringstream *)(local_1b0 + 8);
  do {
    if (iVar2 == 1) {
      pcVar3 = "GL_ARB_shader_atomic_counters";
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_ARB_shader_atomic_counters");
      if (bVar1) goto LAB_00a26394;
    }
    else {
      if (iVar2 == 3) {
        bVar1 = this->m_has_test_passed == false;
        if (bVar1) {
          pcVar3 = "Fail";
        }
        else {
          pcVar3 = "Pass";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,pcVar3
                  );
        return STOP;
      }
LAB_00a26394:
      local_1b0._0_4_ = iVar2;
      getVertexShader_abi_cxx11_(&vs_body,(NegativeTest11 *)pcVar3,(_test_case *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,&local_24d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_24e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_24f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_250);
      local_24c = 0;
      pcVar3 = (char *)&vs_body;
      bVar1 = Utils::buildProgram(local_238,(string *)pcVar3,(string *)local_1b0,&local_210,
                                  &local_230,&local_1d0,(GLchar **)0x0,&local_24c,local_240,
                                  (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,local_248)
      ;
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)local_1b0);
      if (bVar1) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        pcVar3 = "A program object was successfully built for [";
        std::operator<<((ostream *)this_00,"A program object was successfully built for [");
        local_230._M_dataplus._M_p._0_4_ = iVar2;
        getTestCaseString_abi_cxx11_(&local_210,(NegativeTest11 *)pcVar3,(_test_case *)&local_230);
        std::operator<<((ostream *)this_00,(string *)&local_210);
        std::operator<<((ostream *)this_00,"] test case, even though it was invalid.");
        pcVar3 = &tcu::TestLog::EndMessage;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this->m_has_test_passed = false;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
      std::__cxx11::string::~string((string *)&vs_body);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult NegativeTest11::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all test cases */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		if (static_cast<_test_case>(test_case) == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT &&
			!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_atomic_counters"))
		{
			/* This iteration requires atomic counter support that this GL implementation
			 * is not capable of. Skip the iteration
			 */
			continue;
		}

		/* Try to build a program object using invalid vertex shader, specific to the
		 * iteration we're currently in */
		std::string vs_body = getVertexShader(static_cast<_test_case>(test_case));

		if (ShaderSubroutine::Utils::buildProgram(gl, vs_body, "",   /* tc_body */
												  "",				 /* te_body */
												  "",				 /* gs_body */
												  "",				 /* fs_body */
												  DE_NULL,			 /* xfb_varyings */
												  0,				 /* n_xfb_varyings */
												  &m_vs_id, DE_NULL, /* out_tc_id */
												  DE_NULL,			 /* out_te_id */
												  DE_NULL,			 /* out_gs_id */
												  DE_NULL,			 /* out_fs_id */
												  &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << getTestCaseString(static_cast<_test_case>(test_case))
							   << "] test case, even though it was invalid." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}